

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O0

void ym2608_set_mute_mask(void *chip,UINT32 MuteMask)

{
  byte local_21;
  UINT8 CurChn;
  YM2608 *F2608;
  UINT32 MuteMask_local;
  void *chip_local;
  
  for (local_21 = 0; local_21 < 6; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 * 0x198 + 0x4908) =
         (byte)(MuteMask >> (local_21 & 0x1f)) & 1;
  }
  for (local_21 = 0; local_21 < 6; local_21 = local_21 + 1) {
    *(byte *)((long)chip + (ulong)local_21 * 0x40 + 0x5158) =
         (byte)(MuteMask >> (local_21 + 6 & 0x1f)) & 1;
  }
  *(byte *)((long)chip + 0x5408) = (byte)(MuteMask >> 0xc) & 1;
  return;
}

Assistant:

void ym2608_set_mute_mask(void *chip, UINT32 MuteMask)
{
	YM2608 *F2608 = (YM2608 *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2608->CH[CurChn].Muted = (MuteMask >> CurChn) & 0x01;
	for (CurChn = 0; CurChn < 6; CurChn ++)
		F2608->adpcm[CurChn].Muted = (MuteMask >> (CurChn + 6)) & 0x01;
	F2608->MuteDeltaT = (MuteMask >> 12) & 0x01;
	
	return;
}